

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview_p.h
# Opt level: O2

void __thiscall
QTreeViewPrivate::AnimatedOperation::updateCurrentValue(AnimatedOperation *this,QVariant *param_1)

{
  QWidget *this_00;
  long in_FS_OFFSET;
  QRect local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->viewport;
  local_20 = rect(this);
  QWidget::update(this_00,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void updateCurrentValue(const QVariant &) override { viewport->update(rect()); }